

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O1

void do_olc(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  editor_cmd_type *peVar5;
  char command [4608];
  char local_1228 [4608];
  
  bVar2 = check_security(ch);
  if (bVar2) {
    pcVar3 = one_argument(argument,local_1228);
    if (local_1228[0] == '\0') {
LAB_0035b113:
      do_help(ch,"olc");
    }
    else {
      bVar2 = str_prefix(local_1228,"area");
      if (bVar2) {
        lVar1 = 0;
        do {
          lVar4 = lVar1;
          if (lVar4 + 0x10 == 0x40) goto LAB_0035b113;
          bVar2 = str_prefix(local_1228,*(char **)((long)&editor_table[1].name + lVar4));
          lVar1 = lVar4 + 0x10;
        } while (bVar2);
        peVar5 = (editor_cmd_type *)(lVar4 + 0x4ab220);
      }
      else {
        peVar5 = editor_table;
      }
      (*peVar5->do_fun)(ch,pcVar3);
    }
  }
  return;
}

Assistant:

void do_olc(CHAR_DATA *ch, char *argument)
{
	char command[MAX_INPUT_LENGTH];
	int cmd;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, command);

	if (command[0] == '\0')
	{
		do_help(ch, "olc");
		return;
	}

	/* Search Table and Dispatch Command. */
	for (cmd = 0; editor_table[cmd].name != nullptr; cmd++)
	{
		if (!str_prefix(command, editor_table[cmd].name))
		{
			(*editor_table[cmd].do_fun)(ch, argument);
			return;
		}
	}

	/* Invalid command, send help. */
	do_help(ch, "olc");
}